

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

bool __thiscall roaring::Roaring64Map::isEmpty(Roaring64Map *this)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  *in_RDI;
  
  cVar2 = std::
          map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
          ::cbegin(in_RDI);
  cVar3 = std::
          map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
          ::cend(in_RDI);
  bVar1 = std::
          all_of<std::_Rb_tree_const_iterator<std::pair<unsigned_int_const,roaring::Roaring>>,roaring::Roaring64Map::isEmpty()const::_lambda(std::pair<unsigned_int_const,roaring::Roaring>const&)_1_>
                    (cVar2._M_node,cVar3._M_node);
  return bVar1;
}

Assistant:

bool isEmpty() const {
        return std::all_of(
            roarings.cbegin(), roarings.cend(),
            [](const std::pair<const uint32_t, Roaring> &map_entry) {
                return map_entry.second.isEmpty();
            });
    }